

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

void __thiscall axl::io::MappedFile::attach(MappedFile *this,Handle fileHandle,uint_t flags)

{
  uint_t in_EDX;
  int in_ESI;
  MappedFile *in_RDI;
  
  close(in_RDI,in_ESI);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::attach
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
             CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
  in_RDI->m_fileFlags = in_EDX;
  return;
}

Assistant:

void
MappedFile::attach(
	File::Handle fileHandle,
	uint_t flags
) {
	close();

	m_file.m_file.attach(fileHandle);
	m_fileFlags = flags;
}